

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O1

void __thiscall Jinx::Variant::Copy(Variant *this,Variant *copy)

{
  ValueType VVar1;
  size_type sVar2;
  
  VVar1 = copy->m_type;
  this->m_type = VVar1;
  switch(VVar1) {
  case Null:
    goto switchD_001664ac_caseD_0;
  case Number:
    (this->field_1).m_number = (copy->field_1).m_number;
switchD_001664ac_caseD_0:
    return;
  case Integer:
  case Function:
    (this->field_1).m_number = (copy->field_1).m_number;
    return;
  case Boolean:
    (this->field_1).m_boolean = (copy->field_1).m_boolean;
    return;
  case String:
    (this->field_1).m_collection.
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)((long)&this->field_1 + 0x10);
    (this->field_1).m_string._M_string_length = 0;
    *(undefined1 *)((long)&this->field_1 + 0x10) = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
              (&(this->field_1).m_string,&(copy->field_1).m_string);
    return;
  case Collection:
  case Coroutine:
  case UserObject:
  case Buffer:
    (this->field_1).m_number = 0.0;
    (this->field_1).m_string._M_string_length = 0;
    (this->field_1).m_number = (copy->field_1).m_number;
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->field_1).m_collection.
                super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(copy->field_1).m_collection.
                super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  case CollectionItr:
    (this->field_1).m_number = 0.0;
    (this->field_1).m_string._M_string_length = 0;
    (this->field_1).m_collectionItrPair.second.
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->field_1).m_number = (copy->field_1).m_number;
    (this->field_1).m_string._M_string_length = (copy->field_1).m_string._M_string_length;
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->field_1).m_collectionItrPair.second.
                super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(copy->field_1).m_collectionItrPair.second.
                super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  case Guid:
    sVar2 = (copy->field_1).m_string._M_string_length;
    (this->field_1).m_number = (copy->field_1).m_number;
    (this->field_1).m_string._M_string_length = sVar2;
    return;
  case ValType:
    (this->field_1).m_valType = (copy->field_1).m_valType;
    return;
  default:
    __assert_fail("!\"Unknown variant type!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                  ,0x322a,"void Jinx::Variant::Copy(const Variant &)");
  }
}

Assistant:

inline void Variant::Copy(const Variant & copy)
	{
		m_type = copy.m_type;
		switch (m_type)
		{
			case ValueType::Null:
				break;
			case ValueType::Number:
				m_number = copy.m_number;
				break;
			case ValueType::Integer:
				m_integer = copy.m_integer;
				break;
			case ValueType::Boolean:
				m_boolean = copy.m_boolean;
				break;
			case ValueType::String:
				new(&m_string) String();
				m_string = copy.m_string;
				break;
			case ValueType::Collection:
				new(&m_collection) CollectionPtr();
				m_collection = copy.m_collection;
				break;
			case ValueType::CollectionItr:
				new(&m_collectionItrPair) CollectionItrPair();
				m_collectionItrPair = copy.m_collectionItrPair;
				break;
			case ValueType::Function:
				m_function = copy.m_function;
				break;
			case ValueType::Coroutine:
				new(&m_coroutine) CoroutinePtr();
				m_coroutine = copy.m_coroutine;
				break;
			case ValueType::UserObject:
				new(&m_userObject) UserObjectPtr();
				m_userObject = copy.m_userObject;
				break;
			case ValueType::Buffer:
				new(&m_buffer) BufferPtr();
				m_buffer = copy.m_buffer;
				break;
			case ValueType::Guid:
				m_guid = copy.m_guid;
				break;
			case ValueType::ValType:
				m_valType = copy.m_valType;
				break;
			default:
				assert(!"Unknown variant type!");
		};
	}